

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateBinaryOp(ExpressionTranslateContext *ctx,ExprBinaryOp *expression)

{
  bool bVar1;
  ExprBinaryOp *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  bVar1 = isType<TypeEnum>((expression->super_ExprBase).type);
  if (bVar1) {
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,"(");
  }
  if (*(int *)&(expression->super_ExprBase).field_0x2c == 6) {
    Print(ctx,"__nullcPow((");
    Translate(ctx,expression->lhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->lhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
    Print(ctx,", (");
    Translate(ctx,expression->rhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->rhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
    Print(ctx,")");
  }
  else if ((*(int *)&(expression->super_ExprBase).field_0x2c == 5) &&
          ((expression->lhs->type == ctx->ctx->typeFloat ||
           (expression->lhs->type == ctx->ctx->typeDouble)))) {
    Print(ctx,"__nullcMod((");
    Translate(ctx,expression->lhs);
    Print(ctx,"), (");
    Translate(ctx,expression->rhs);
    Print(ctx,"))");
  }
  else if (*(int *)&(expression->super_ExprBase).field_0x2c == 0x14) {
    Print(ctx,"!!(");
    Translate(ctx,expression->lhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->lhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
    Print(ctx," != !!(");
    Translate(ctx,expression->rhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->rhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
  }
  else {
    Print(ctx,"(");
    Translate(ctx,expression->lhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->lhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
    switch(*(undefined4 *)&(expression->super_ExprBase).field_0x2c) {
    case 1:
      Print(ctx," + ");
      break;
    case 2:
      Print(ctx," - ");
      break;
    case 3:
      Print(ctx," * ");
      break;
    case 4:
      Print(ctx," / ");
      break;
    case 5:
      Print(ctx," %% ");
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x363,"void TranslateBinaryOp(ExpressionTranslateContext &, ExprBinaryOp *)");
    case 7:
      Print(ctx," << ");
      break;
    case 8:
      Print(ctx," >> ");
      break;
    case 9:
      Print(ctx," < ");
      break;
    case 10:
      Print(ctx," <= ");
      break;
    case 0xb:
      Print(ctx," > ");
      break;
    case 0xc:
      Print(ctx," >= ");
      break;
    case 0xd:
      Print(ctx," == ");
      break;
    case 0xe:
      Print(ctx," != ");
      break;
    case 0xf:
      Print(ctx," & ");
      break;
    case 0x10:
      Print(ctx," | ");
      break;
    case 0x11:
      Print(ctx," ^ ");
      break;
    case 0x12:
      Print(ctx," && ");
      break;
    case 0x13:
      Print(ctx," || ");
    }
    Print(ctx,"(");
    Translate(ctx,expression->rhs);
    Print(ctx,")");
    bVar1 = isType<TypeEnum>(expression->rhs->type);
    if (bVar1) {
      Print(ctx,".value");
    }
  }
  bVar1 = isType<TypeEnum>((expression->super_ExprBase).type);
  if (bVar1) {
    Print(ctx,")");
  }
  return;
}

Assistant:

void TranslateBinaryOp(ExpressionTranslateContext &ctx, ExprBinaryOp *expression)
{
	if(isType<TypeEnum>(expression->type))
	{
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "(");
	}

	if(expression->op == SYN_BINARY_OP_POW)
	{
		Print(ctx, "__nullcPow((");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		Print(ctx, ", (");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");

		Print(ctx, ")");
	}
	else if(expression->op == SYN_BINARY_OP_MOD && (expression->lhs->type == ctx.ctx.typeFloat || expression->lhs->type == ctx.ctx.typeDouble))
	{
		Print(ctx, "__nullcMod((");
		Translate(ctx, expression->lhs);
		Print(ctx, "), (");
		Translate(ctx, expression->rhs);
		Print(ctx, "))");
	}
	else if(expression->op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		Print(ctx, "!!(");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		Print(ctx, " != !!(");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");
	}
	else
	{
		Print(ctx, "(");
		Translate(ctx, expression->lhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->lhs->type))
			Print(ctx, ".value");

		switch(expression->op)
		{
		case SYN_BINARY_OP_ADD:
			Print(ctx, " + ");
			break;
		case SYN_BINARY_OP_SUB:
			Print(ctx, " - ");
			break;
		case SYN_BINARY_OP_MUL:
			Print(ctx, " * ");
			break;
		case SYN_BINARY_OP_DIV:
			Print(ctx, " / ");
			break;
		case SYN_BINARY_OP_MOD:
			Print(ctx, " %% ");
			break;
		case SYN_BINARY_OP_SHL:
			Print(ctx, " << ");
			break;
		case SYN_BINARY_OP_SHR:
			Print(ctx, " >> ");
			break;
		case SYN_BINARY_OP_LESS:
			Print(ctx, " < ");
			break;
		case SYN_BINARY_OP_LESS_EQUAL:
			Print(ctx, " <= ");
			break;
		case SYN_BINARY_OP_GREATER:
			Print(ctx, " > ");
			break;
		case SYN_BINARY_OP_GREATER_EQUAL:
			Print(ctx, " >= ");
			break;
		case SYN_BINARY_OP_EQUAL:
			Print(ctx, " == ");
			break;
		case SYN_BINARY_OP_NOT_EQUAL:
			Print(ctx, " != ");
			break;
		case SYN_BINARY_OP_BIT_AND:
			Print(ctx, " & ");
			break;
		case SYN_BINARY_OP_BIT_OR:
			Print(ctx, " | ");
			break;
		case SYN_BINARY_OP_BIT_XOR:
			Print(ctx, " ^ ");
			break;
		case SYN_BINARY_OP_LOGICAL_AND:
			Print(ctx, " && ");
			break;
		case SYN_BINARY_OP_LOGICAL_OR:
			Print(ctx, " || ");
			break;
		default:
			assert(!"unknown type");
		}

		Print(ctx, "(");
		Translate(ctx, expression->rhs);
		Print(ctx, ")");

		if(isType<TypeEnum>(expression->rhs->type))
			Print(ctx, ".value");
	}

	if(isType<TypeEnum>(expression->type))
	{
		Print(ctx, ")");
	}
}